

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

xmlChar * htmlFindEntityPrefix(xmlChar *string,size_t slen,int isAttr,int *nlen,int *rlen)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  byte *pbVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  long local_58;
  
  if ((slen < 2) || (0x19 < (*string | 0x20) - 0x61)) {
    pbVar11 = (byte *)0x0;
  }
  else {
    lVar2 = (ulong)(*string & 0x3f) * 3;
    uVar14 = (uint)*(ushort *)("" + lVar2);
    uVar8 = (uint)""[lVar2 + 2] + (uint)*(ushort *)("" + lVar2);
    uVar6 = 1;
    local_58 = 0;
    pbVar11 = (byte *)0x0;
    do {
      if (uVar8 < uVar14 || uVar8 - uVar14 == 0) break;
      uVar13 = (uVar8 - uVar14 >> 1) + uVar14;
      uVar5 = (ulong)htmlEntValues[uVar13];
      bVar1 = htmlEntStrings[uVar5];
      uVar12 = (ulong)(bVar1 & 0x3f);
      iVar4 = (uint)string[uVar6] - (uint)htmlEntStrings[uVar5 + 1];
      if (iVar4 == 0) {
        if (uVar12 <= slen) {
          iVar4 = strncmp((char *)(string + uVar6 + 1),(char *)(htmlEntStrings + uVar5 + 2),
                          uVar12 - 1);
          goto LAB_0016b62c;
        }
        iVar4 = strncmp((char *)(string + uVar6 + 1),(char *)(htmlEntStrings + uVar5 + 2),slen - 1);
        if (iVar4 != 0) goto LAB_0016b62c;
        bVar3 = true;
      }
      else {
LAB_0016b62c:
        if (iVar4 < 0) {
          bVar3 = false;
          uVar8 = uVar13;
        }
        else {
          if (iVar4 == 0) {
            uVar7 = uVar6 + uVar12;
            uVar9 = 0;
            if (uVar7 < slen) {
              uVar9 = (uint)string[uVar7];
            }
            bVar15 = (uVar9 | 0x20) - 0x7b < 0xffffffe6;
            bVar16 = uVar9 - 0x3a < 0xfffffff6;
            bVar3 = true;
            bVar10 = true;
            if (uVar9 != 0x3b) {
              if ((char)bVar1 < '\0' && isAttr != 0) {
                bVar10 = uVar9 != 0x3d && (bVar16 && bVar15);
              }
              else {
                bVar10 = (bool)(bVar1 >> 7);
              }
            }
            if (bVar10 != false) {
              local_58 = (uVar9 == 0x3b) + uVar7;
            }
            if (bVar10 != false) {
              pbVar11 = htmlEntStrings + uVar12 + uVar5 + 1;
            }
            if (((bVar1 & 0x40) == 0) ||
               (pbVar11 = pbVar11 + (ulong)bVar10 * 2, slen <= uVar7 || bVar16 && bVar15))
            goto LAB_0016b6fe;
            uVar14 = uVar13 + htmlEntStrings[uVar12 + uVar5 + 1];
            uVar8 = htmlEntStrings[uVar12 + uVar5 + 2] + uVar14;
          }
          else {
            uVar14 = uVar13 + 1;
            uVar7 = uVar6;
          }
          bVar3 = false;
          uVar6 = uVar7;
        }
      }
LAB_0016b6fe:
    } while (!bVar3);
    if (pbVar11 == (byte *)0x0) {
      pbVar11 = (byte *)0x0;
    }
    else {
      *nlen = (int)local_58;
      *rlen = (uint)*pbVar11;
      pbVar11 = pbVar11 + 1;
    }
  }
  return pbVar11;
}

Assistant:

static const xmlChar *
htmlFindEntityPrefix(const xmlChar *string, size_t slen, int isAttr,
                     int *nlen, int *rlen) {
    const xmlChar *match = NULL;
    unsigned left, right;
    int first = string[0];
    size_t matchLen = 0;
    size_t soff = 1;

    if (slen < 2)
        return(NULL);
    if (!IS_ASCII_LETTER(first))
        return(NULL);

    /*
     * Look up range by first character
     */
    first &= 63;
    left = htmlEntAlpha[first*3] | htmlEntAlpha[first*3+1] << 8;
    right = left + htmlEntAlpha[first*3+2];

    /*
     * Binary search
     */
    while (left < right) {
        const xmlChar *bytes;
        unsigned mid;
        size_t len;
        int cmp;

        mid = left + (right - left) / 2;
        bytes = htmlEntStrings + htmlEntValues[mid];
        len = bytes[0] & ~ENT_F_ALL;

        cmp = string[soff] - bytes[1];

        if (cmp == 0) {
            if (slen < len) {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              slen - 1);
                /* Prefix can never match */
                if (cmp == 0)
                    break;
            } else {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              len - 1);
            }
        }

        if (cmp < 0) {
            right = mid;
        } else if (cmp > 0) {
            left = mid + 1;
        } else {
            int term = soff + len < slen ? string[soff + len] : 0;
            int isAlnum, isTerm;

            isAlnum = IS_ALNUM(term);
            isTerm = ((term == ';') ||
                      ((bytes[0] & ENT_F_SEMICOLON) &&
                       ((!isAttr) ||
                        ((!isAlnum) && (term != '=')))));

            if (isTerm) {
                match = bytes + len + 1;
                matchLen = soff + len;
                if (term == ';')
                    matchLen += 1;
            }

            if (bytes[0] & ENT_F_SUBTABLE) {
                if (isTerm)
                    match += 2;

                if ((isAlnum) && (soff + len < slen)) {
                    left = mid + bytes[len + 1];
                    right = left + bytes[len + 2];
                    soff += len;
                    continue;
                }
            }

            break;
        }
    }

    if (match == NULL)
        return(NULL);

    *nlen = matchLen;
    *rlen = match[0];
    return(match + 1);
}